

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O1

Array2D<double> * __thiscall TNT::Array2D<double>::ref(Array2D<double> *this,Array2D<double> *A)

{
  int *piVar1;
  double **ppdVar2;
  double *pdVar3;
  
  if (this != A) {
    piVar1 = (this->v_).v_.ref_count_;
    if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
      operator_delete(piVar1,4);
      ppdVar2 = (this->v_).v_.data_;
      if (ppdVar2 != (double **)0x0) {
        operator_delete__(ppdVar2);
      }
      (this->v_).v_.data_ = (double **)0x0;
    }
    (this->v_).v_.data_ = (A->v_).v_.data_;
    (this->v_).v_.ref_count_ = (A->v_).v_.ref_count_;
    piVar1 = (A->v_).v_.ref_count_;
    if (piVar1 != (int *)0x0) {
      *piVar1 = *piVar1 + 1;
    }
    (this->v_).n_ = (A->v_).n_;
    (this->v_).data_ = (A->v_).data_;
    piVar1 = (this->data_).v_.ref_count_;
    if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
      operator_delete(piVar1,4);
      pdVar3 = (this->data_).v_.data_;
      if (pdVar3 != (double *)0x0) {
        operator_delete__(pdVar3);
      }
      (this->data_).v_.data_ = (double *)0x0;
    }
    (this->data_).v_.data_ = (A->data_).v_.data_;
    (this->data_).v_.ref_count_ = (A->data_).v_.ref_count_;
    piVar1 = (A->data_).v_.ref_count_;
    if (piVar1 != (int *)0x0) {
      *piVar1 = *piVar1 + 1;
    }
    (this->data_).n_ = (A->data_).n_;
    (this->data_).data_ = (A->data_).data_;
    this->m_ = A->m_;
    this->n_ = A->n_;
  }
  return this;
}

Assistant:

Array2D<T> & Array2D<T>::ref(const Array2D<T> &A)
{
	if (this != &A)
	{
		v_ = A.v_;
		data_ = A.data_;
		m_ = A.m_;
		n_ = A.n_;
		
	}
	return *this;
}